

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskBuilder.cpp
# Opt level: O3

int __thiscall
DiskBuilder::LoadDisk
          (DiskBuilder *this,
          vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> *file_list,
          IDisk **created_disk,ILoadingProgress *loading_progress)

{
  pointer ppFVar1;
  FormatType *pFVar2;
  int iVar3;
  pointer ppFVar4;
  vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> local_48;
  
  ppFVar1 = (this->format_list_).super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar1 ==
      (this->format_list_).super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar3 = -1;
  }
  else {
    do {
      ppFVar4 = ppFVar1 + 1;
      pFVar2 = *ppFVar1;
      std::vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>::vector
                (&local_48,file_list);
      iVar3 = (*pFVar2->_vptr_FormatType[7])(pFVar2,&local_48,created_disk,loading_progress);
      std::vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>::~vector(&local_48)
      ;
      if (iVar3 == 0) break;
      ppFVar1 = ppFVar4;
    } while (ppFVar4 !=
             (this->format_list_).super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
    iVar3 = -(uint)(iVar3 != 0);
  }
  return iVar3;
}

Assistant:

int DiskBuilder::LoadDisk(std::vector<FormatType::TrackItem> file_list, IDisk*& created_disk,
                          ILoadingProgress* loading_progress)
{
   for (auto it = format_list_.begin(); it != format_list_.end(); it++)
   {
      if ((*it)->LoadDisk(file_list, created_disk, loading_progress) == 0)
         return 0;;
   }
   return -1;
}